

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CGL::Collada::ColladaParser::parse_material(XMLElement *xml,MaterialInfo *material)

{
  bool bVar1;
  XMLElement *pXVar2;
  XMLElement *pXVar3;
  char *pcVar4;
  BSDF *pBVar5;
  XMLElement *pXVar6;
  XMLElement *pXVar7;
  string *this;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar15 [12];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  allocator local_419;
  MaterialInfo *local_418;
  XMLElement *local_410;
  Vector3D radiance;
  string type;
  Vector3D k;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(material->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(material->super_Instance).name);
  (material->super_Instance).type = MATERIAL;
  local_418 = material;
  std::__cxx11::string::string((string *)&local_2d0,"instance_effect",(allocator *)&type);
  pXVar2 = get_element(xml,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (pXVar2 == (XMLElement *)0x0) {
    exit(1);
  }
  pXVar3 = get_technique_common(pXVar2);
  pXVar2 = get_technique_CGL(pXVar2);
  if (pXVar2 != (XMLElement *)0x0) {
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar2->super_XMLNode,(char *)0x0);
    do {
      if (pXVar2 == (XMLElement *)0x0) {
        return;
      }
      pcVar4 = tinyxml2::XMLNode::Value(&pXVar2->super_XMLNode);
      std::__cxx11::string::string((string *)&type,pcVar4,(allocator *)&radiance);
      bVar1 = std::operator==(&type,"emission");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_50,"radiance",(allocator *)&radiance);
        pXVar3 = get_element(pXVar2,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
        std::__cxx11::string::string((string *)&local_70,pcVar4,(allocator *)&k);
        spectrum_from_string(&radiance,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pBVar5 = (BSDF *)operator_new(0x50);
        pBVar5->_vptr_BSDF = (_func_int **)strtok;
        pBVar5[1].reflectanceMap = (HDRImageBuffer *)radiance.field_0.field_0.x;
        pBVar5[1].normalMap = (HDRImageBuffer *)radiance.field_0.field_0.y;
        pBVar5[2]._vptr_BSDF = (_func_int **)radiance.field_0.field_0.z;
        pBVar5[2].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_0029f430;
LAB_00114ce4:
        local_418->bsdf = pBVar5;
      }
      else {
        bVar1 = std::operator==(&type,"mirror");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_90,"reflectance",(allocator *)&radiance);
          pXVar3 = get_element(pXVar2,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string((string *)&local_b0,pcVar4,(allocator *)&k);
          spectrum_from_string(&radiance,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          pBVar5 = (BSDF *)operator_new(0x40);
          pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_0029f548;
          pBVar5[1].reflectanceMap = (HDRImageBuffer *)radiance.field_0.field_0.x;
          pBVar5[1].normalMap = (HDRImageBuffer *)radiance.field_0.field_0.y;
          pBVar5[2]._vptr_BSDF = (_func_int **)radiance.field_0.field_0.z;
          goto LAB_00114ce4;
        }
        bVar1 = std::operator==(&type,"microfacet");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_d0,"reflectance",(allocator *)&radiance);
          get_element(pXVar2,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::string((string *)&local_f0,"alpha",(allocator *)&radiance);
          pXVar3 = get_element(pXVar2,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::string((string *)&local_110,"eta",(allocator *)&radiance);
          pXVar6 = get_element(pXVar2,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::string((string *)&local_130,"k",(allocator *)&radiance);
          pXVar7 = get_element(pXVar2,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          local_410 = (XMLElement *)atof(pcVar4);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar6);
          std::__cxx11::string::string((string *)&local_150,pcVar4,(allocator *)&k);
          spectrum_from_string(&radiance,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar7);
          std::__cxx11::string::string((string *)&local_170,pcVar4,&local_419);
          spectrum_from_string(&k,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          pBVar5 = (BSDF *)operator_new(0x80);
          pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_0029f4e8;
          pBVar5[1].reflectanceMap = (HDRImageBuffer *)radiance.field_0.field_0.x;
          pBVar5[1].normalMap = (HDRImageBuffer *)radiance.field_0.field_0.y;
          pBVar5[2]._vptr_BSDF = (_func_int **)radiance.field_0.field_0.z;
          pBVar5[2].normalMap = (HDRImageBuffer *)k.field_0.field_0.x;
          pBVar5[3]._vptr_BSDF = (_func_int **)k.field_0.field_0.y;
          pBVar5[3].reflectanceMap = (HDRImageBuffer *)k.field_0.field_0.z;
          pBVar5[4]._vptr_BSDF = (_func_int **)(double)(float)(double)local_410;
          pBVar5[4].reflectanceMap = (HDRImageBuffer *)&PTR__Sampler2D_0029f370;
          pBVar5[4].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_0029f430;
          goto LAB_00114ce4;
        }
        bVar1 = std::operator==(&type,"refraction");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_190,"transmittance",(allocator *)&radiance);
          pXVar3 = get_element(pXVar2,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::string((string *)&local_1b0,"roughness",(allocator *)&radiance);
          pXVar6 = get_element(pXVar2,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::string((string *)&local_1d0,"ior",(allocator *)&radiance);
          pXVar7 = get_element(pXVar2,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string((string *)&local_1f0,pcVar4,(allocator *)&k);
          spectrum_from_string(&radiance,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          auVar13._8_56_ = extraout_var;
          auVar13._0_8_ = extraout_XMM1_Qa;
          auVar15 = auVar13._4_12_;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar6);
          local_410 = (XMLElement *)atof(pcVar4);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar8 = atof(pcVar4);
          pBVar5 = (BSDF *)operator_new(0x50);
          auVar9._0_4_ = (float)(double)local_410;
          auVar9._4_12_ = auVar15;
          auVar11._0_4_ = (float)dVar8;
          auVar11._4_12_ = auVar15;
          auVar9 = vinsertps_avx(auVar11,auVar9,0x10);
          pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_0029f5a8;
          auVar9 = vcvtps2pd_avx(auVar9);
          pBVar5[1]._vptr_BSDF = (_func_int **)auVar9._0_8_;
          pBVar5[1].reflectanceMap = (HDRImageBuffer *)auVar9._8_8_;
          pBVar5[2]._vptr_BSDF = (_func_int **)radiance.field_0.field_0.x;
          pBVar5[2].reflectanceMap = (HDRImageBuffer *)radiance.field_0.field_0.y;
          pBVar5[2].normalMap = (HDRImageBuffer *)radiance.field_0.field_0.z;
          goto LAB_00114ce4;
        }
        bVar1 = std::operator==(&type,"glass");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_210,"transmittance",(allocator *)&radiance);
          pXVar3 = get_element(pXVar2,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::string((string *)&local_230,"reflectance",(allocator *)&radiance);
          pXVar6 = get_element(pXVar2,&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::string((string *)&local_250,"roughness",(allocator *)&radiance);
          local_410 = get_element(pXVar2,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::string((string *)&local_270,"ior",(allocator *)&radiance);
          pXVar7 = get_element(pXVar2,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string((string *)&local_290,pcVar4,(allocator *)&k);
          spectrum_from_string(&radiance,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar6);
          std::__cxx11::string::string((string *)&local_2b0,pcVar4,&local_419);
          spectrum_from_string(&k,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          auVar14._8_56_ = extraout_var_00;
          auVar14._0_8_ = extraout_XMM1_Qa_00;
          auVar15 = auVar14._4_12_;
          pcVar4 = tinyxml2::XMLElement::GetText(local_410);
          local_410 = (XMLElement *)atof(pcVar4);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar8 = atof(pcVar4);
          pBVar5 = (BSDF *)operator_new(0x70);
          auVar10._0_4_ = (float)(double)local_410;
          auVar10._4_12_ = auVar15;
          auVar12._0_4_ = (float)dVar8;
          auVar12._4_12_ = auVar15;
          auVar9 = vinsertps_avx(auVar12,auVar10,0x10);
          pBVar5->_vptr_BSDF = (_func_int **)&PTR_f_0029f608;
          auVar9 = vcvtps2pd_avx(auVar9);
          pBVar5[1]._vptr_BSDF = (_func_int **)auVar9._0_8_;
          pBVar5[1].reflectanceMap = (HDRImageBuffer *)auVar9._8_8_;
          pBVar5[2]._vptr_BSDF = (_func_int **)k.field_0.field_0.x;
          pBVar5[2].reflectanceMap = (HDRImageBuffer *)k.field_0.field_0.y;
          pBVar5[2].normalMap = (HDRImageBuffer *)k.field_0.field_0.z;
          pBVar5[3].reflectanceMap = (HDRImageBuffer *)radiance.field_0.field_0.x;
          pBVar5[3].normalMap = (HDRImageBuffer *)radiance.field_0.field_0.y;
          pBVar5[4]._vptr_BSDF = (_func_int **)radiance.field_0.field_0.z;
          goto LAB_00114ce4;
        }
      }
      pXVar2 = tinyxml2::XMLNode::NextSiblingElement(&pXVar2->super_XMLNode,(char *)0x0);
      std::__cxx11::string::~string((string *)&type);
    } while( true );
  }
  if (pXVar3 == (XMLElement *)0x0) {
LAB_00114e31:
    pBVar5 = (BSDF *)operator_new(0x50);
    pBVar5->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar5[1].reflectanceMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar5[1].normalMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar5[2]._vptr_BSDF = (_func_int **)0x3fe0000000000000;
  }
  else {
    std::__cxx11::string::string((string *)&local_2f0,"phong/diffuse/color",(allocator *)&type);
    pXVar2 = get_element(pXVar3,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string((string *)&local_310,"lambert/diffuse/color",(allocator *)&type);
    pXVar3 = get_element(pXVar3,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    if (pXVar3 == (XMLElement *)0x0) {
      if (pXVar2 == (XMLElement *)0x0) goto LAB_00114e31;
      pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
      std::__cxx11::string::string((string *)&local_350,pcVar4,(allocator *)&radiance);
      spectrum_from_string((Vector3D *)&type,&local_350);
      this = &local_350;
    }
    else {
      pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
      std::__cxx11::string::string((string *)&local_330,pcVar4,(allocator *)&radiance);
      spectrum_from_string((Vector3D *)&type,&local_330);
      this = &local_330;
    }
    std::__cxx11::string::~string((string *)this);
    pBVar5 = (BSDF *)operator_new(0x50);
    pBVar5->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar5[1].reflectanceMap = (HDRImageBuffer *)type._M_dataplus._M_p;
    pBVar5[1].normalMap = (HDRImageBuffer *)type._M_string_length;
    pBVar5[2]._vptr_BSDF = (_func_int **)type.field_2._M_allocated_capacity;
  }
  pBVar5[2].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_0029f430;
  local_418->bsdf = pBVar5;
  return;
}

Assistant:

void ColladaParser::parse_material ( XMLElement* xml, MaterialInfo& material ) {

  // name & id
  material.id   = xml->Attribute( "id" );
  material.name = xml->Attribute("name");
  material.type = Instance::MATERIAL;

  // parse effect
  XMLElement* e_effect = get_element(xml, "instance_effect");
  if (e_effect) {

    // if the material does not have additional specification in the 462
    // profile. The diffuse color will be used to create a diffuse BSDF,
    // Other information from the common profile are ignored

    XMLElement* tech_common = get_technique_common(e_effect); // common profile
    XMLElement* tech_CGL = get_technique_CGL(e_effect); // CGL profile

    if (tech_CGL) {
      XMLElement *e_bsdf = tech_CGL->FirstChildElement();
      while (e_bsdf) {
        string type = e_bsdf->Name();
        if (type == "emission") {
          XMLElement *e_radiance  = get_element(e_bsdf, "radiance");
          Vector3D radiance = spectrum_from_string(string(e_radiance->GetText()));
          BSDF* bsdf = new EmissionBSDF(radiance);
          material.bsdf = bsdf;
        } else if (type == "mirror") {
          XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
          Vector3D reflectance = spectrum_from_string(string(e_reflectance->GetText()));
          BSDF* bsdf = new MirrorBSDF(reflectance);
          material.bsdf = bsdf;
        } else if (type == "microfacet") {
          XMLElement* e_reflectance = get_element(e_bsdf, "reflectance");
          XMLElement* e_alpha = get_element(e_bsdf, "alpha");
          XMLElement* e_eta = get_element(e_bsdf, "eta");
          XMLElement* e_k = get_element(e_bsdf, "k");
          float alpha = atof(e_alpha->GetText());
          Vector3D eta = spectrum_from_string(string(e_eta->GetText()));
          Vector3D k = spectrum_from_string(string(e_k->GetText()));
          BSDF* bsdf = new MicrofacetBSDF(eta, k, alpha);
          material.bsdf = bsdf;
        } else if (type == "refraction") {
          XMLElement *e_transmittance  = get_element(e_bsdf, "transmittance");
          XMLElement *e_roughness = get_element(e_bsdf, "roughness");
          XMLElement *e_ior = get_element(e_bsdf, "ior");
          Vector3D transmittance = spectrum_from_string(string(e_transmittance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new RefractionBSDF(transmittance, roughness, ior);
          material.bsdf = bsdf;
        } else if (type == "glass") {
          XMLElement *e_transmittance  = get_element(e_bsdf, "transmittance");
          XMLElement *e_reflectance  = get_element(e_bsdf, "reflectance");
          XMLElement *e_roughness = get_element(e_bsdf, "roughness");
          XMLElement *e_ior = get_element(e_bsdf, "ior");
          Vector3D transmittance = spectrum_from_string(string(e_transmittance->GetText()));
          Vector3D reflectance = spectrum_from_string(string(e_reflectance->GetText()));
          float roughness = atof(e_roughness->GetText());
          float ior = atof(e_ior->GetText());
          BSDF* bsdf = new GlassBSDF(transmittance, reflectance, roughness, ior);
          material.bsdf = bsdf;
        }
        e_bsdf = e_bsdf->NextSiblingElement();
      }
    } else if (tech_common) {
      XMLElement* e_phong_diffuse = get_element(tech_common, "phong/diffuse/color");
      XMLElement* e_lambert_diffuse = get_element(tech_common, "lambert/diffuse/color");
      if (e_lambert_diffuse) {
        Vector3D reflectance = spectrum_from_string(string(e_lambert_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(reflectance);
      } else if (e_phong_diffuse) {
        Vector3D reflectance = spectrum_from_string(string(e_phong_diffuse->GetText()));
        material.bsdf = new DiffuseBSDF(reflectance);
      } else {
        material.bsdf = new DiffuseBSDF(Vector3D(.5f,.5f,.5f));
      }
    } else {
      BSDF* bsdf = new DiffuseBSDF(Vector3D(.5f,.5f,.5f));
      material.bsdf = bsdf;
    }
  } else {
    stat("Error: no target effects found for material: " << material.id);
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << material);
}